

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsObject::QGraphicsObject(QGraphicsObject *this,QGraphicsItem *parent)

{
  QObject::QObject((QObject *)this,(QObject *)0x0);
  QGraphicsItem::QGraphicsItem((QGraphicsItem *)(this + 0x10),parent);
  *(undefined ***)this = &PTR_metaObject_007eb578;
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsObject_007eb5e8;
  *(ulong *)(*(long *)(this + 0x18) + 0x160) =
       *(ulong *)(*(long *)(this + 0x18) + 0x160) | 0x100000000000000;
  return;
}

Assistant:

QGraphicsObject::QGraphicsObject(QGraphicsItem *parent)
        : QGraphicsItem(parent)
{
    QGraphicsItem::d_ptr->isObject = true;
}